

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O1

NodeRefPtr<4> __thiscall
embree::sse2::BVHBuilderBinnedFastSpatialSAH::
CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMi<4>>>::
operator()(CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMi<4>>>
           *this,PrimRef *prims,range<unsigned_long> *range,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  float fVar3;
  float fVar4;
  ThreadLocal2 *this_00;
  iterator __position;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  __pointer_type pFVar8;
  char *pcVar9;
  ulong uVar10;
  size_t sVar11;
  undefined1 *puVar12;
  long lVar13;
  unsigned_long uVar14;
  ulong uVar15;
  long lVar16;
  PrimRef *pPVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  vuint<4> geomID;
  vuint<4> v1;
  vuint<4> v2;
  MutexSys *local_a8;
  undefined8 uStack_a0;
  __pointer_type local_90;
  MutexSys *local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  ThreadLocal2 *local_78;
  undefined8 uStack_70;
  ThreadLocal2 *local_68;
  undefined8 uStack_60;
  ulong local_50;
  float local_48 [6];
  
  uVar10 = range->_begin;
  uVar21 = range->_end;
  if (uVar10 < uVar21) {
    puVar12 = (undefined1 *)((long)&prims[uVar10].lower.field_0 + 0xc);
    do {
      puVar12[3] = puVar12[3] & 7;
      uVar10 = uVar10 + 1;
      uVar21 = range->_end;
      puVar12 = puVar12 + 0x20;
    } while (uVar10 < uVar21);
  }
  uVar14 = range->_begin;
  uVar10 = (uVar21 - uVar14) + 3;
  local_50 = uVar10 >> 2;
  local_88 = (MutexSys *)(local_50 * 0x50);
  this_00 = (alloc.talloc1)->parent;
  local_90 = alloc.alloc;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    uStack_70 = CONCAT71(uStack_70._1_7_,1);
    local_78 = this_00;
    MutexSys::lock(&this_00->mutex);
    pFVar8 = local_90;
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (local_90 == (__pointer_type)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = local_90->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = local_90->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = local_90;
    UNLOCK();
    local_a8 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    uStack_a0 = CONCAT71(uStack_a0._1_7_,1);
    local_68 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (pFVar8->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pFVar8->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&local_90->thread_local_allocators,__position,&local_68);
    }
    else {
      *__position._M_current = local_68;
      pppTVar2 = &(pFVar8->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if ((char)uStack_a0 == '\x01') {
      MutexSys::unlock(local_a8);
    }
    if ((char)uStack_70 == '\x01') {
      MutexSys::unlock(&local_78->mutex);
    }
  }
  (alloc.talloc1)->bytesUsed = (long)&local_88->mutex + (alloc.talloc1)->bytesUsed;
  sVar11 = (alloc.talloc1)->cur;
  uVar15 = (ulong)(-(int)sVar11 & 0xf);
  uVar21 = (long)&local_88->mutex + uVar15 + sVar11;
  (alloc.talloc1)->cur = uVar21;
  if ((alloc.talloc1)->end < uVar21) {
    (alloc.talloc1)->cur = sVar11;
    if ((MutexSys *)(alloc.talloc1)->allocBlockSize < (MutexSys *)((long)local_88 << 2)) {
      pcVar9 = (char *)FastAllocator::malloc(local_90,(size_t)&local_88);
    }
    else {
      local_a8 = (MutexSys *)(alloc.talloc1)->allocBlockSize;
      pcVar9 = (char *)FastAllocator::malloc(local_90,(size_t)&local_a8);
      (alloc.talloc1)->ptr = pcVar9;
      sVar11 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
      (alloc.talloc1)->bytesWasted = sVar11;
      (alloc.talloc1)->cur = 0;
      (alloc.talloc1)->end = (size_t)local_a8;
      (alloc.talloc1)->cur = (size_t)local_88;
      if (local_a8 < local_88) {
        (alloc.talloc1)->cur = 0;
        local_a8 = (MutexSys *)(alloc.talloc1)->allocBlockSize;
        pcVar9 = (char *)FastAllocator::malloc(local_90,(size_t)&local_a8);
        (alloc.talloc1)->ptr = pcVar9;
        sVar11 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar11;
        (alloc.talloc1)->cur = 0;
        (alloc.talloc1)->end = (size_t)local_a8;
        (alloc.talloc1)->cur = (size_t)local_88;
        if (local_a8 < local_88) {
          (alloc.talloc1)->cur = 0;
          pcVar9 = (char *)0x0;
        }
        else {
          (alloc.talloc1)->bytesWasted = sVar11;
        }
      }
      else {
        (alloc.talloc1)->bytesWasted = sVar11;
      }
    }
  }
  else {
    (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar15;
    pcVar9 = (alloc.talloc1)->ptr + (uVar21 - (long)local_88);
  }
  if (3 < uVar10) {
    lVar13 = 0;
    do {
      uVar10 = range->_end;
      lVar16 = *(long *)(*(long *)this + 0x68);
      local_a8 = (MutexSys *)0x0;
      uStack_a0 = 0;
      local_78 = (ThreadLocal2 *)0x0;
      uStack_70 = 0;
      local_68 = (ThreadLocal2 *)0x0;
      uStack_60 = 0;
      local_88 = (MutexSys *)0xffffffffffffffff;
      uStack_80 = 0xffffffff;
      uStack_7c = 0xffffffff;
      local_48[0] = -NAN;
      local_48[1] = -NAN;
      local_48[2] = -NAN;
      local_48[3] = -NAN;
      pPVar17 = prims + uVar14;
      lVar18 = 0;
      do {
        if (uVar14 < uVar10) {
          fVar3 = (pPVar17->lower).field_0.m128[3];
          *(float *)((long)&local_88 + lVar18) = fVar3;
          fVar4 = (pPVar17->upper).field_0.m128[3];
          *(float *)((long)local_48 + lVar18) = fVar4;
          lVar5 = *(long *)(*(long *)(lVar16 + 0x1e8) + (ulong)(uint)fVar3 * 8);
          lVar6 = *(long *)(lVar5 + 0x58);
          lVar20 = (ulong)(uint)fVar4 * *(long *)(lVar5 + 0x68);
          uVar19 = *(uint *)(lVar5 + 0xa0) >> 2;
          *(uint *)((long)&local_a8 + lVar18) = *(int *)(lVar6 + lVar20) * uVar19;
          *(uint *)((long)&local_78 + lVar18) = *(int *)(lVar6 + 4 + lVar20) * uVar19;
          *(uint *)((long)&local_68 + lVar18) = uVar19 * *(int *)(lVar6 + 8 + lVar20);
          uVar14 = uVar14 + 1;
        }
        else if (lVar18 != 0) {
          *(undefined4 *)((long)&local_88 + lVar18) = local_88._0_4_;
          *(undefined4 *)((long)local_48 + lVar18) = 0xffffffff;
          uVar7 = local_a8._0_4_;
          *(undefined4 *)((long)&local_a8 + lVar18) = local_a8._0_4_;
          *(undefined4 *)((long)&local_78 + lVar18) = uVar7;
          *(undefined4 *)((long)&local_68 + lVar18) = uVar7;
        }
        if (uVar14 < uVar10) {
          pPVar17 = prims + uVar14;
        }
        lVar18 = lVar18 + 4;
      } while (lVar18 != 0x10);
      lVar16 = lVar13 * 0x50;
      *(MutexSys **)(pcVar9 + lVar16) = local_a8;
      *(undefined8 *)(pcVar9 + lVar16 + 8) = uStack_a0;
      *(ThreadLocal2 **)(pcVar9 + lVar16 + 0x10) = local_78;
      *(undefined8 *)(pcVar9 + lVar16 + 0x10 + 8) = uStack_70;
      *(ThreadLocal2 **)(pcVar9 + lVar16 + 0x20) = local_68;
      *(undefined8 *)(pcVar9 + lVar16 + 0x20 + 8) = uStack_60;
      *(MutexSys **)(pcVar9 + lVar16 + 0x30) = local_88;
      *(ulong *)(pcVar9 + lVar16 + 0x30 + 8) = CONCAT44(uStack_7c,uStack_80);
      *(ulong *)(pcVar9 + lVar16 + 0x40) = CONCAT44(local_48[1],local_48[0]);
      *(ulong *)(pcVar9 + lVar16 + 0x40 + 8) = CONCAT44(local_48[3],local_48[2]);
      lVar13 = lVar13 + 1;
    } while (lVar13 != local_50 + (local_50 == 0));
  }
  uVar10 = 7;
  if (local_50 < 7) {
    uVar10 = local_50;
  }
  return (NodeRefPtr<4>)(uVar10 | (ulong)pcVar9 | 8);
}

Assistant:

__noinline ReductionTy operator() (PrimRef* prims, const range<size_t>& range, Allocator alloc) const
        {
          for (size_t i=range.begin(); i<range.end(); i++)
            prims[i].lower.u &= GEOMID_MASK;

          return userCreateLeaf(prims,range,alloc);
        }